

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

Maybe<kj::HttpByteRange> *
kj::anon_unknown_36::consumeSuffixRange
          (Maybe<kj::HttpByteRange> *__return_storage_ptr__,char **ptr,uint64_t contentLength)

{
  char *pcVar1;
  NullableValue<unsigned_int> *other;
  uint *puVar2;
  HttpByteRange local_80;
  HttpByteRange local_70;
  uint local_60;
  uint *local_58;
  uint *n;
  undefined1 local_40 [8];
  NullableValue<unsigned_int> local_38;
  NullableValue<unsigned_int> _n1206;
  uint suffixLength;
  char *p;
  uint64_t contentLength_local;
  char **ptr_local;
  
  _suffixLength = (PromiseArena *)*ptr;
  p = (char *)contentLength;
  contentLength_local = (uint64_t)ptr;
  ptr_local = (char **)__return_storage_ptr__;
  pcVar1 = skipSpace((char *)_suffixLength);
  _suffixLength = (PromiseArena *)(pcVar1 + 1);
  if (*pcVar1 == '-') {
    _suffixLength = (PromiseArena *)skipSpace((char *)_suffixLength);
    consumeNumber((kj *)local_40,(char **)&suffixLength);
    other = kj::_::readMaybe<unsigned_int>((Maybe<unsigned_int> *)local_40);
    kj::_::NullableValue<unsigned_int>::NullableValue
              ((NullableValue<unsigned_int> *)(local_40 + 8),other);
    Maybe<unsigned_int>::~Maybe((Maybe<unsigned_int> *)local_40);
    puVar2 = kj::_::NullableValue::operator_cast_to_unsigned_int_((NullableValue *)(local_40 + 8));
    if (puVar2 == (uint *)0x0) {
      Maybe<kj::HttpByteRange>::Maybe(__return_storage_ptr__);
    }
    else {
      local_58 = kj::_::NullableValue<unsigned_int>::operator*
                           ((NullableValue<unsigned_int> *)(local_40 + 8));
      _n1206._0_4_ = *local_58;
    }
    local_60 = (uint)(puVar2 == (uint *)0x0);
    kj::_::NullableValue<unsigned_int>::~NullableValue
              ((NullableValue<unsigned_int> *)(local_40 + 8));
    if (local_60 == 0) {
      _suffixLength = (PromiseArena *)skipSpace((char *)_suffixLength);
      *(PromiseArena **)contentLength_local = _suffixLength;
      if ((char *)(ulong)(uint)_n1206._0_4_ < p) {
        local_80.start = (long)p - (ulong)(uint)_n1206._0_4_;
        local_80.end = (uint64_t)(p + -1);
        Maybe<kj::HttpByteRange>::Maybe(__return_storage_ptr__,&local_80);
      }
      else {
        local_70.start = 0;
        local_70.end = (uint64_t)(p + -1);
        Maybe<kj::HttpByteRange>::Maybe(__return_storage_ptr__,&local_70);
      }
    }
  }
  else {
    Maybe<kj::HttpByteRange>::Maybe(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

static kj::Maybe<HttpByteRange> consumeSuffixRange(const char*& ptr, uint64_t contentLength) {
  const char* p = ptr;
  p = skipSpace(p);
  if (*(p++) != '-') return kj::none;
  p = skipSpace(p);
  uint suffixLength;
  KJ_IF_SOME(n, consumeNumber(p)) {
    suffixLength = n;
  } else {
    return kj::none;
  }